

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

DynamicType * __thiscall
Js::JavascriptLibrary::CreateFunctionWithConfigurableLengthType
          (JavascriptLibrary *this,DynamicObject *prototype,FunctionInfo *functionInfo)

{
  ScriptContext *scriptContext;
  bool bVar1;
  undefined4 *puVar2;
  DynamicType *pDVar3;
  code *pcVar4;
  
  if ((functionInfo->functionBodyImpl).ptr != (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar2 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar2 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x505,"(!functionInfo->HasBody())","!functionInfo->HasBody()");
    if (!bVar1) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  scriptContext = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (this->inProfileMode == false) {
    pcVar4 = FunctionInfo::GetOriginalEntryPoint(functionInfo);
  }
  else {
    pcVar4 = ScriptContext::DebugProfileProbeThunk;
  }
  pDVar3 = DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,pcVar4
                            ,(DynamicTypeHandler *)SharedFunctionWithConfigurableLengthTypeHandler,
                            false,false);
  return pDVar3;
}

Assistant:

DynamicType * JavascriptLibrary::CreateFunctionWithConfigurableLengthType(DynamicObject * prototype, FunctionInfo * functionInfo)
    {
        Assert(!functionInfo->HasBody());
        return DynamicType::New(scriptContext, TypeIds_Function, prototype,
            this->inProfileMode? ProfileEntryThunk : functionInfo->GetOriginalEntryPoint(),
            &SharedFunctionWithConfigurableLengthTypeHandler);
    }